

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_append(uchar **out,size_t *outsize,uchar *chunk)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uchar *new_buffer;
  uchar *chunk_start;
  size_t new_length;
  size_t total_chunk_length;
  uchar *puStack_28;
  uint i;
  uchar *chunk_local;
  size_t *outsize_local;
  uchar **out_local;
  
  puStack_28 = chunk;
  chunk_local = (uchar *)outsize;
  outsize_local = (size_t *)out;
  uVar2 = lodepng_chunk_length(chunk);
  iVar3 = lodepng_addofl((ulong)uVar2,0xc,&new_length);
  if (iVar3 == 0) {
    iVar3 = lodepng_addofl(*(size_t *)chunk_local,new_length,(size_t *)&chunk_start);
    if (iVar3 == 0) {
      pvVar4 = lodepng_realloc((void *)*outsize_local,(size_t)chunk_start);
      if (pvVar4 == (void *)0x0) {
        out_local._4_4_ = 0x53;
      }
      else {
        *outsize_local = (size_t)pvVar4;
        *(uchar **)chunk_local = chunk_start;
        sVar1 = *outsize_local;
        for (total_chunk_length._4_4_ = 0; total_chunk_length._4_4_ != new_length;
            total_chunk_length._4_4_ = total_chunk_length._4_4_ + 1) {
          chunk_start[(ulong)total_chunk_length._4_4_ + (sVar1 - new_length)] =
               puStack_28[total_chunk_length._4_4_];
        }
        out_local._4_4_ = 0;
      }
    }
    else {
      out_local._4_4_ = 0x4d;
    }
  }
  else {
    out_local._4_4_ = 0x4d;
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outsize, const unsigned char* chunk) {
  unsigned i;
  size_t total_chunk_length, new_length;
  unsigned char *chunk_start, *new_buffer;

  if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return 77;
  if(lodepng_addofl(*outsize, total_chunk_length, &new_length)) return 77;

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outsize) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}